

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_contains_Test::~test_matrix_sparse_contains_Test
          (test_matrix_sparse_contains_Test *this)

{
  test_matrix_sparse_contains_Test *this_local;
  
  ~test_matrix_sparse_contains_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_sparse, contains) {
  Matrix_Sparse matrix({0, 1, 2, 3}, {1, 2, 1}, {3.0, 4.0, 5.0}, 3);
  EXPECT_TRUE(matrix.contains(0, 1));
  EXPECT_TRUE(matrix.contains(1, 2));
  EXPECT_FALSE(matrix.contains(0, 0));
  EXPECT_FALSE(matrix.contains(2, 0));

  // edge cases
  matrix = Matrix_Sparse({0, 0, 0}, {}, {}, 2);
  EXPECT_FALSE(matrix.contains(0, 0));
  EXPECT_FALSE(matrix.contains(0, 1));
  EXPECT_FALSE(matrix.contains(1, 0));
  EXPECT_FALSE(matrix.contains(1, 1));
}